

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexInternalShape.h
# Opt level: O2

char * __thiscall
btConvexInternalShape::serialize
          (btConvexInternalShape *this,void *dataBuffer,btSerializer *serializer)

{
  btCollisionShape::serialize((btCollisionShape *)this,dataBuffer,serializer);
  btVector3::serializeFloat
            (&this->m_implicitShapeDimensions,(btVector3FloatData *)((long)dataBuffer + 0x20));
  btVector3::serializeFloat
            ((btVector3 *)&(this->super_btConvexShape).super_btCollisionShape.field_0x1c,
             (btVector3FloatData *)((long)dataBuffer + 0x10));
  *(btScalar *)((long)dataBuffer + 0x30) = this->m_collisionMargin;
  return "btConvexInternalShapeData";
}

Assistant:

SIMD_FORCE_INLINE	const char*	btConvexInternalShape::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btConvexInternalShapeData* shapeData = (btConvexInternalShapeData*) dataBuffer;
	btCollisionShape::serialize(&shapeData->m_collisionShapeData, serializer);

	m_implicitShapeDimensions.serializeFloat(shapeData->m_implicitShapeDimensions);
	m_localScaling.serializeFloat(shapeData->m_localScaling);
	shapeData->m_collisionMargin = float(m_collisionMargin);

	return "btConvexInternalShapeData";
}